

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall TeamChangeIRCCommand::create(TeamChangeIRCCommand *this)

{
  Jupiter::Command::addTrigger(this,4,"team");
  Jupiter::Command::addTrigger(this,2,"tc");
  Jupiter::Command::addTrigger(this,3,"ftc");
  Jupiter::Command::addTrigger(this,7,"forcetc");
  Jupiter::Command::addTrigger(this,10,"teamchange");
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void TeamChangeIRCCommand::create() {
	this->addTrigger("team"sv);
	this->addTrigger("tc"sv);
	this->addTrigger("ftc"sv);
	this->addTrigger("forcetc"sv);
	this->addTrigger("teamchange"sv);
	this->setAccessLevel(3);
}